

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

void Abc_TgCalcScc(Abc_TgMan_t *pMan,int *pOut,int fSort)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  TiedGroup *pTVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int sum_1;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  int sum;
  int iVar13;
  int v;
  int *piVar14;
  int i;
  int iVar15;
  int kv [10];
  ulong *local_70;
  int local_64;
  ulong local_60;
  uint local_58 [10];
  
  local_70 = pMan->pTruth;
  uVar6 = pMan->nVars;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_64 = fSort;
  memset(pOut,0,(long)(int)uVar6 * 4);
  if ((long)(int)uVar6 < 7) {
    if (uVar6 != 6) {
      uVar7 = 1L << ((byte)uVar6 & 0x3f);
      uVar10 = ~(-1L << ((byte)uVar7 & 0x3f)) & *local_70;
      *local_70 = uVar10;
      uVar2 = uVar7;
      uVar11 = uVar10;
      if (uVar6 < 6) {
        do {
          uVar11 = uVar11 | uVar10 << ((byte)uVar2 & 0x3f);
          uVar2 = uVar2 + uVar7;
        } while (uVar2 < 0x40);
        *local_70 = uVar11;
      }
    }
    if (0 < (int)uVar6) {
      uVar2 = *local_70;
      uVar11 = 0;
      do {
        uVar7 = 0;
        iVar8 = 0;
        iVar13 = 0;
        do {
          if ((s_Truths6Neg[uVar11] >> (uVar7 & 0x3f) & 1) != 0) {
            if ((1L << ((byte)uVar7 & 0x3f) & uVar2) != 0) {
              iVar13 = iVar13 + (1 << (*(byte *)(Abc_TtCountOnesInCofsFast6_rec::bit_count + iVar8)
                                      & 0x1f));
            }
            iVar8 = iVar8 + 1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != 0x40);
        pOut[uVar11] = pOut[uVar11] + iVar13;
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar6);
    }
  }
  else if (uVar6 - 6 != 0x1f) {
    uVar5 = 1 << ((byte)(uVar6 - 6) & 0x1f);
    if ((int)uVar5 < 2) {
      uVar5 = 1;
    }
    local_60 = (ulong)uVar5;
    uVar2 = 0;
    do {
      uVar11 = local_70[uVar2];
      iVar8 = Abc_TtCountOnesInCofsFast6_rec::bit_count[uVar2 >> 8 & 0xffffff];
      iVar13 = Abc_TtCountOnesInCofsFast6_rec::bit_count[uVar2 & 0xff];
      lVar3 = 0;
      do {
        uVar7 = 0;
        iVar15 = 0;
        iVar9 = 0;
        do {
          if ((s_Truths6Neg[lVar3] >> (uVar7 & 0x3f) & 1) != 0) {
            if ((1L << ((byte)uVar7 & 0x3f) & uVar11) != 0) {
              iVar9 = iVar9 + (1 << ((char)Abc_TtCountOnesInCofsFast6_rec::bit_count[iVar15] +
                                     (char)iVar8 + (char)iVar13 & 0x1fU));
            }
            iVar15 = iVar15 + 1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != 0x40);
        pOut[lVar3] = pOut[lVar3] + iVar9;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 6);
      uVar7 = 6;
      do {
        if (((uint)uVar2 >> ((int)uVar7 - 6U & 0x1f) & 1) == 0) {
          uVar5 = *(uint *)((long)&local_70 + uVar7 * 4);
          if (uVar11 == 0) {
            iVar8 = 0;
          }
          else {
            uVar10 = 0;
            piVar14 = Abc_TtCountOnesInCofsFast6_rec::bit_count;
            iVar8 = 0;
            do {
              if ((uVar11 >> (uVar10 & 0x3f) & 1) != 0) {
                iVar8 = iVar8 + (1 << ((char)*piVar14 +
                                       (char)Abc_TtCountOnesInCofsFast6_rec::bit_count
                                             [(int)uVar5 >> 8] +
                                       (char)Abc_TtCountOnesInCofsFast6_rec::bit_count[uVar5 & 0xff]
                                      & 0x1fU));
              }
              uVar10 = uVar10 + 1;
              piVar14 = piVar14 + 1;
            } while (uVar10 != 0x40);
          }
          pOut[uVar7] = pOut[uVar7] + iVar8;
          *(uint *)((long)&local_70 + uVar7 * 4) = uVar5 + 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar6);
      uVar2 = uVar2 + 1;
    } while (uVar2 != local_60);
  }
  if (0 < pMan->nGVars) {
    lVar3 = 0;
    iVar8 = 0;
    do {
      iVar13 = pOut[iVar8];
      pOut[lVar3] = iVar13;
      bVar12 = pMan->pPerm[lVar3];
      if (-1 < (char)bVar12) {
        piVar14 = pOut + (long)iVar8 + 1;
        do {
          if ((-1 < pMan->symLink[bVar12]) && (iVar13 != *piVar14)) {
            __assert_fail("pMan->symLink[k] < 0 || pOut[j] == pOut[i]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                          ,0x8fc,"void Abc_TgCalcScc(Abc_TgMan_t *, int *, int)");
          }
          bVar12 = pMan->symLink[bVar12];
          iVar8 = iVar8 + 1;
          piVar14 = piVar14 + 1;
        } while (-1 < (char)bVar12);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pMan->nGVars);
  }
  if ((local_64 != 0) && (0 < pMan->nGroups)) {
    pTVar4 = pMan->pGroup;
    do {
      cVar1 = pTVar4->nGVars;
      if (1 < cVar1) {
        uVar6 = (uint)pTVar4->iStart;
        lVar3 = (long)(int)uVar6;
        uVar2 = lVar3 + 1;
        do {
          iVar8 = pOut[uVar2];
          uVar7 = uVar2 & 0xffffffff;
          uVar11 = uVar2;
          if (lVar3 < (long)uVar2) {
            do {
              uVar7 = uVar11;
              if (pOut[uVar7 - 1] <= iVar8) goto LAB_00502dc9;
              pOut[uVar7] = pOut[uVar7 - 1];
              uVar11 = uVar7 - 1;
            } while (lVar3 < (long)(uVar7 - 1));
            uVar7 = (ulong)uVar6;
          }
LAB_00502dc9:
          pOut[(int)uVar7] = iVar8;
          uVar2 = uVar2 + 1;
        } while ((long)uVar2 < (long)(int)((int)cVar1 + uVar6));
      }
      pTVar4 = pTVar4 + 1;
    } while (pTVar4 < pMan->pGroup + pMan->nGroups);
  }
  return;
}

Assistant:

static void Abc_TgCalcScc(Abc_TgMan_t * pMan, int * pOut, int fSort)
{
    int i, j, k;
    TiedGroup * pGrp;

    Abc_TtSccInCofs(pMan->pTruth, pMan->nVars, pOut);

    for (i = j = 0; j < pMan->nGVars; j++)
    {
        pOut[j] = pOut[i];
        for (k = pMan->pPerm[j]; k >= 0; k = pMan->symLink[k])
        {
            i++;
            assert(pMan->symLink[k] < 0 || pOut[j] == pOut[i]);
        }
    }
    if (!fSort) return;

    for (pGrp = pMan->pGroup; pGrp < pMan->pGroup + pMan->nGroups; pGrp++)
    {
        int vb = pGrp->iStart, ve = vb + pGrp->nGVars;
        for (i = vb + 1; i < ve; i++)
        {
            int a = pOut[i];
            for (j = i; j > vb && pOut[j - 1] > a; j--)
                pOut[j] = pOut[j - 1];
            pOut[j] = a;
        }
    }
}